

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase283::run(TestCase283 *this)

{
  long lVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  SourceLocation location_00;
  undefined8 uVar3;
  void *pvVar4;
  void **params_2;
  void *__buf;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:291:46)>
  *location_01;
  SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:305:9)>
  *location_02;
  int in_R8D;
  bool returned;
  bool destroyed;
  anon_class_8_1_8c041cb9_for_func local_258;
  void *continuationTracePtr_1;
  Promise<void> promise;
  void *continuationTracePtr;
  SourceLocation in_stack_fffffffffffffdd0;
  Own<capnp::RequestHook,_std::nullptr_t> local_210;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_200;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1f8;
  Promise<void> destructionPromise;
  anon_class_8_1_d59fe34d_for_func local_1e8;
  PromiseFulfillerPair<void> paf;
  undefined1 local_1c8 [48];
  WaitScope waitScope;
  int handleCount;
  int callCount;
  char *local_170;
  undefined *puStack_168;
  undefined8 local_160;
  char *local_158;
  undefined *puStack_150;
  undefined8 local_148;
  char *local_140;
  undefined *puStack_138;
  undefined8 local_130;
  char *local_128;
  undefined *puStack_120;
  undefined8 local_118;
  Client client;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_c8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop loop;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  kj::newPromiseAndFulfiller<void>(in_stack_fffffffffffffdd0);
  destroyed = false;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:291:46)>
       ::anon_class_8_1_8c041cb9_for_func::operator();
  lVar1 = *(long *)((long)paf.promise.super_PromiseBase.node.ptr + 8);
  local_258.destroyed = &destroyed;
  if (lVar1 == 0 || (ulong)((long)paf.promise.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:291:46)>
                   *)((long)pvVar4 + 0x3d8);
    params_2 = &continuationTracePtr;
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestCase283::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestCase283::run()::__0,void*&>
              (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,&local_258,
               params_2);
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    *(undefined8 *)((long)paf.promise.super_PromiseBase.node.ptr + 8) = 0;
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:291:46)>
                   *)((long)paf.promise.super_PromiseBase.node.ptr + -0x28);
    params_2 = &continuationTracePtr;
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestCase283::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestCase283::run()::__0,void*&>
              (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&paf,&local_258,
               params_2);
    *(long *)((long)paf.promise.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  local_1c8._0_8_ = (PromiseNode *)0x0;
  client._0_8_ = 0;
  continuationTracePtr_1 = location_01;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&client);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1c8);
  location.function = &DAT_0042222c;
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  location.lineNumber = 0x123;
  location.columnNumber = 0x1d;
  kj::Promise<void>::eagerlyEvaluate(&destructionPromise,&continuationTracePtr_1,location);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_1);
  callCount = 0;
  handleCount = 0;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
            ((kj *)&continuationTracePtr,&callCount,&handleCount);
  capnproto_test::capnp::test::TestMoreStuff::Client::Client<capnp::_::TestMoreStuffImpl,void>
            (&client,(Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&continuationTracePtr);
  kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::dispose
            ((Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)&continuationTracePtr);
  promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  returned = false;
  local_c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)&continuationTracePtr,&client,&local_c0);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
            ((kj *)&continuationTracePtr_1,&paf.fulfiller);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestCapDestructor,void>
            ((Client *)local_1c8,
             (Own<capnp::_::TestCapDestructor,_std::nullptr_t> *)&continuationTracePtr_1);
  capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams::Builder::setCap
            ((Builder *)&continuationTracePtr,(Client *)local_1c8);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_1c8 + 8));
  kj::Own<capnp::_::TestCapDestructor,_std::nullptr_t>::dispose
            ((Own<capnp::_::TestCapDestructor,_std::nullptr_t> *)&continuationTracePtr_1);
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_1c8,(int)&continuationTracePtr,__buf,(size_t)params_2,in_R8D);
  uVar3 = local_1c8._0_8_;
  local_1e8.returned = &returned;
  continuationTracePtr_1 =
       kj::_::
       SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:305:9)>
       ::anon_class_8_1_d59fe34d_for_func::operator();
  pPVar2 = ((PromiseArenaMember *)local_1c8._0_8_)->arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_1c8._0_8_ - (long)pPVar2) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_02 = (SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:305:9)>
                   *)((long)pvVar4 + 0x3d8);
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase283::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestCase283::run()::__1,void*&>
              (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1c8,&local_1e8,
               &continuationTracePtr_1);
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((PromiseArenaMember *)local_1c8._0_8_)->arena = (PromiseArena *)0x0;
    location_02 = (SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:305:9)>
                   *)&(((PromiseNode *)(local_1c8._0_8_ + -0x30))->super_PromiseArenaMember).arena;
    kj::
    ctor<kj::_::SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase283::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestCase283::run()::__1,void*&>
              (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_1c8,&local_1e8,
               &continuationTracePtr_1);
    (((PromiseNode *)(uVar3 + -0x20))->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)pPVar2;
  }
  local_258.destroyed = (bool *)0x0;
  local_c8.ptr = (PromiseNode *)0x0;
  local_200.ptr = (PromiseNode *)location_02;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_c8);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_258);
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_120 = &DAT_0042222c;
  local_118 = 0xf00000130;
  location_00.function = &DAT_0042222c;
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  location_00.lineNumber = 0x130;
  location_00.columnNumber = 0xf;
  kj::Promise<void>::eagerlyEvaluate((Promise<void> *)&local_1f8,&local_200,location_00);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_1f8);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1f8);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_200);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults> *)
             local_1c8);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_210);
  kj::yield();
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_138 = &DAT_0042222c;
  local_130 = 0x300000135;
  kj::Promise<void>::wait((Promise<void> *)&continuationTracePtr,&waitScope);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  kj::yield();
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_150 = &DAT_0042222c;
  local_148 = 0x300000136;
  kj::Promise<void>::wait((Promise<void> *)&continuationTracePtr,&waitScope);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  continuationTracePtr = (void *)(CONCAT71(continuationTracePtr._1_7_,destroyed) ^ 1);
  if ((destroyed & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x139,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
               (char (*) [30])"failed: expected !(destroyed)",
               (DebugExpression<bool> *)&continuationTracePtr);
  }
  continuationTracePtr = (void *)(CONCAT71(continuationTracePtr._1_7_,returned) ^ 1);
  if ((returned != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x13a,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
               (char (*) [29])"failed: expected !(returned)",
               (DebugExpression<bool> *)&continuationTracePtr);
  }
  continuationTracePtr = (void *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_168 = &DAT_0042222c;
  local_160 = 0x30000013d;
  kj::Promise<void>::wait(&destructionPromise,&waitScope);
  continuationTracePtr = &destroyed;
  if (kj::_::Debug::minSeverity < 3 && destroyed == false) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x13f,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
               (char (*) [27])"failed: expected destroyed",
               (DebugExpression<bool_&> *)&continuationTracePtr);
  }
  continuationTracePtr = (void *)(CONCAT71(continuationTracePtr._1_7_,returned) ^ 1);
  if ((returned != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x140,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
               (char (*) [29])"failed: expected !(returned)",
               (DebugExpression<bool> *)&continuationTracePtr);
  }
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&client.field_0x8);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&destructionPromise);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, AsyncCancelation) {
  // Tests cancellation.

  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  int callCount = 0;
  int handleCount = 0;

  test::TestMoreStuff::Client client(kj::heap<TestMoreStuffImpl>(callCount, handleCount));

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(test::TestInterface::Client(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller))));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::yield().wait(waitScope);
  kj::yield().wait(waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}